

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOrderDirectories.cxx
# Opt level: O0

void __thiscall
cmOrderDirectories::AddRuntimeLibrary(cmOrderDirectories *this,string *fullPath,char *soname)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  cmOrderDirectoriesConstraintSOName *pcVar5;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar6;
  cmOrderDirectoriesConstraintSOName *local_108;
  uint local_fc;
  cmOrderDirectoriesConstraintSOName *local_f8;
  _Self local_f0;
  _Self local_e8;
  string local_e0;
  byte local_b9;
  string local_b8;
  byte local_91;
  string local_90;
  undefined1 local_60 [8];
  string dir;
  char *soname_local;
  string *fullPath_local;
  cmOrderDirectories *this_local;
  
  pVar6 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert(&this->EmmittedConstraintSOName,fullPath);
  dir.field_2._8_8_ = pVar6.first._M_node;
  if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    bVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(&this->ImplicitDirectories);
    if (!bVar1) {
      cmsys::SystemTools::GetFilenamePath((string *)local_60,fullPath);
      lVar4 = std::__cxx11::string::rfind((char *)fullPath,0x9669c7);
      if (lVar4 != -1) {
        if ((AddRuntimeLibrary(std::__cxx11::string_const&,char_const*)::splitFramework == '\0') &&
           (iVar3 = __cxa_guard_acquire(&AddRuntimeLibrary(std::__cxx11::string_const&,char_const*)
                                         ::splitFramework), iVar3 != 0)) {
          cmsys::RegularExpression::RegularExpression
                    (&AddRuntimeLibrary::splitFramework,"^(.*)/(.*).framework/(.*)$");
          __cxa_atexit(cmsys::RegularExpression::~RegularExpression,
                       &AddRuntimeLibrary::splitFramework,&__dso_handle);
          __cxa_guard_release(&AddRuntimeLibrary(std::__cxx11::string_const&,char_const*)::
                               splitFramework);
        }
        local_91 = 0;
        local_b9 = 0;
        bVar2 = cmsys::RegularExpression::find(&AddRuntimeLibrary::splitFramework,fullPath);
        bVar1 = false;
        if (bVar2) {
          cmsys::RegularExpression::match_abi_cxx11_(&local_90,&AddRuntimeLibrary::splitFramework,3)
          ;
          local_91 = 1;
          cmsys::RegularExpression::match_abi_cxx11_(&local_b8,&AddRuntimeLibrary::splitFramework,2)
          ;
          local_b9 = 1;
          lVar4 = std::__cxx11::string::find((string *)&local_90,(ulong)&local_b8);
          bVar1 = lVar4 != -1;
        }
        if ((local_b9 & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_b8);
        }
        if ((local_91 & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_90);
        }
        if (bVar1) {
          cmsys::RegularExpression::match_abi_cxx11_(&local_e0,&AddRuntimeLibrary::splitFramework,1)
          ;
          std::__cxx11::string::operator=((string *)local_60,(string *)&local_e0);
          std::__cxx11::string::~string((string *)&local_e0);
        }
      }
      local_e8._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::find(&this->ImplicitDirectories,(key_type *)local_60);
      local_f0._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(&this->ImplicitDirectories);
      bVar1 = std::operator!=(&local_e8,&local_f0);
      if (bVar1) {
        pcVar5 = (cmOrderDirectoriesConstraintSOName *)operator_new(0xa0);
        cmOrderDirectoriesConstraintSOName::cmOrderDirectoriesConstraintSOName
                  (pcVar5,this,fullPath,soname);
        local_f8 = pcVar5;
        std::vector<cmOrderDirectoriesConstraint_*,_std::allocator<cmOrderDirectoriesConstraint_*>_>
        ::push_back(&this->ImplicitDirEntries,(value_type *)&local_f8);
      }
      local_fc = (uint)bVar1;
      std::__cxx11::string::~string((string *)local_60);
      if (local_fc != 0) {
        return;
      }
    }
    pcVar5 = (cmOrderDirectoriesConstraintSOName *)operator_new(0xa0);
    cmOrderDirectoriesConstraintSOName::cmOrderDirectoriesConstraintSOName
              (pcVar5,this,fullPath,soname);
    local_108 = pcVar5;
    std::vector<cmOrderDirectoriesConstraint_*,_std::allocator<cmOrderDirectoriesConstraint_*>_>::
    push_back(&this->ConstraintEntries,(value_type *)&local_108);
  }
  return;
}

Assistant:

void cmOrderDirectories::AddRuntimeLibrary(std::string const& fullPath,
                                           const char* soname)
{
  // Add the runtime library at most once.
  if(this->EmmittedConstraintSOName.insert(fullPath).second)
    {
    // Implicit link directories need special handling.
    if(!this->ImplicitDirectories.empty())
      {
      std::string dir = cmSystemTools::GetFilenamePath(fullPath);

      if(fullPath.rfind(".framework") != std::string::npos)
        {
        static cmsys::RegularExpression
          splitFramework("^(.*)/(.*).framework/(.*)$");
        if(splitFramework.find(fullPath) &&
          (std::string::npos !=
           splitFramework.match(3).find(splitFramework.match(2))))
          {
          dir = splitFramework.match(1);
          }
        }

      if(this->ImplicitDirectories.find(dir) !=
         this->ImplicitDirectories.end())
        {
        this->ImplicitDirEntries.push_back(
          new cmOrderDirectoriesConstraintSOName(this, fullPath, soname));
        return;
        }
      }

    // Construct the runtime information entry for this library.
    this->ConstraintEntries.push_back(
      new cmOrderDirectoriesConstraintSOName(this, fullPath, soname));
    }
  else
    {
    // This can happen if the same library is linked multiple times.
    // In that case the runtime information check need be done only
    // once anyway.  For shared libs we could add a check in AddItem
    // to not repeat them.
    }
}